

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O1

void __thiscall Valve::convertUnits(Valve *this,Network *nw)

{
  double __x;
  double dVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  
  __x = (this->super_Link).diameter / (nw->units).factors[0];
  (this->super_Link).diameter = __x;
  dVar1 = (this->super_Link).lossCoeff;
  dVar2 = 0.1;
  if (0.1 <= dVar1) {
    dVar2 = dVar1;
  }
  dVar1 = pow(__x,4.0);
  this->lossFactor = (dVar2 * 0.02517) / dVar1;
  (*(this->super_Link).super_Element._vptr_Element[5])((this->super_Link).initSetting,this,nw);
  (this->super_Link).initSetting = extraout_XMM0_Qa;
  return;
}

Assistant:

void Valve::convertUnits(Network* nw)
{
    // ... convert diameter units
    diameter /= nw->ucf(Units::DIAMETER);

    // ... apply a minimum minor loss coeff. if necessary
    double c = lossCoeff;
    if ( c < MIN_LOSS_COEFF ) c = MIN_LOSS_COEFF;

    // ... convert minor loss from V^2/2g basis to Q^2 basis
    lossFactor = 0.02517 * c / pow(diameter, 4);

    // ... convert initial valve setting units
    initSetting = convertSetting(nw, initSetting);
}